

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safe_list.h
# Opt level: O3

void __thiscall obs::safe_list<obs::slot<void_()>_>::node::unlock_all(node *this)

{
  pthread_t pVar1;
  pthread_t pVar2;
  iterator *piVar3;
  int iVar4;
  
  pVar1 = (this->creator_thread)._M_thread;
  pVar2 = pthread_self();
  if (pVar1 == pVar2) {
    piVar3 = this->creator_thread_iterator;
    if (piVar3 != (iterator *)0x0) {
      iVar4 = this->locks;
      do {
        if (piVar3->m_locked == true) {
          if (piVar3->m_node != this) {
            __assert_fail("m_node == node",
                          "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/./obs/safe_list.h"
                          ,0xbb,
                          "void obs::safe_list<obs::slot<void ()>>::iterator::notify_unlock(const node *) [T = obs::slot<void ()>]"
                         );
          }
          piVar3->m_locked = false;
        }
        if (iVar4 < 1) {
          __assert_fail("locks > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/./obs/safe_list.h"
                        ,0x1c9,
                        "void obs::safe_list<obs::slot<void ()>>::node::unlock_all() [T = obs::slot<void ()>]"
                       );
        }
        iVar4 = iVar4 + -1;
        this->locks = iVar4;
        piVar3 = piVar3->m_next_iterator;
      } while (piVar3 != (iterator *)0x0);
    }
    this->creator_thread_iterator = (iterator *)0x0;
  }
  return;
}

Assistant:

void safe_list<T>::node::unlock_all() {
  if (in_creator_thread()) {
    // Notify to all iterators in the creator thread that they don't
    // have the node locked anymore. In this way we can continue the
    // erase() call.
    for (auto it=creator_thread_iterator; it; it=it->m_next_iterator) {
      it->notify_unlock(this);

      assert(locks > 0);
      --locks;
    }
    creator_thread_iterator = nullptr;
  }
}